

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O2

void SoPlex_setRational(void *soplex)

{
  if ((DAT_0033c388 < 2) && (0 < DAT_0033c3f8)) {
    *(undefined4 *)(*(long *)((long)soplex + 0x28) + 0x5c) = 1;
  }
  if ((DAT_0033c38c < 3) && (1 < DAT_0033c3fc)) {
    *(undefined4 *)(*(long *)((long)soplex + 0x28) + 0x60) = 2;
  }
  if ((DAT_0033c390 < 3) && (1 < DAT_0033c400)) {
    *(undefined4 *)(*(long *)((long)soplex + 0x28) + 100) = 2;
  }
  ::soplex::SoPlexBase<double>::setIntParam((SoPlexBase<double> *)soplex,SYNCMODE,1,true);
  ::soplex::SoPlexBase<double>::setRealParam((SoPlexBase<double> *)soplex,FEASTOL,0.0,true);
  ::soplex::SoPlexBase<double>::setRealParam((SoPlexBase<double> *)soplex,OPTTOL,0.0,true);
  return;
}

Assistant:

void SoPlex_setRational(void* soplex)
{
#ifndef SOPLEX_WITH_BOOST
   throw SPxException("Rational functions cannot be used when built without Boost.");
#endif
   /* coverity[unreachable] */
   SoPlex* so = (SoPlex*)(soplex);
   so->setIntParam(SoPlex::READMODE, SoPlex::READMODE_RATIONAL);
   so->setIntParam(SoPlex::SOLVEMODE, SoPlex::SOLVEMODE_RATIONAL);
   so->setIntParam(SoPlex::CHECKMODE, SoPlex::CHECKMODE_RATIONAL);
   so->setIntParam(SoPlex::SYNCMODE, SoPlex::SYNCMODE_AUTO);
   so->setRealParam(SoPlex::FEASTOL, 0.0);
   so->setRealParam(SoPlex::OPTTOL, 0.0);
}